

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassRegistration<chrono::ChKblockGeneric>::create
          (ChClassRegistration<chrono::ChKblockGeneric> *this)

{
  type pvVar1;
  
  pvVar1 = _create<chrono::ChKblockGeneric>(this);
  return pvVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }